

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<long_long,int,5>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (longlong *t,int *u,longlong *result)

{
  long lVar1;
  longlong lVar2;
  long *in_RDX;
  int *in_RSI;
  long *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  if (*in_RDI == 0) {
    *in_RDX = 0;
  }
  else {
    lVar1 = *in_RDI;
    lVar2 = std::numeric_limits<long_long>::min();
    if ((lVar1 == lVar2) && (*in_RSI == -1)) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI / (long)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }